

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  parasail_result_t *ppVar2;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  int *ptr_09;
  int *ptr_10;
  int *ptr_11;
  int *ptr_12;
  int *ptr_13;
  long lVar3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  int *piVar7;
  size_t size;
  int iVar8;
  int iVar9;
  ulong size_00;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  size_t size_01;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint local_d4;
  int local_c4;
  uint local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_58;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_scan_cold_8();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sw_stats_scan_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sw_stats_scan_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sw_stats_scan_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_scan_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_scan_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_sw_stats_scan_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sw_stats_scan_cold_1();
      return (parasail_result_t *)0x0;
    }
    local_d4 = _s1Len;
    if (matrix->type == 0) goto LAB_005530df;
  }
  local_d4 = matrix->length;
LAB_005530df:
  ppVar2 = parasail_result_new_stats();
  if (ppVar2 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar2->flag = ppVar2->flag | 0x1410204;
  size_01 = (size_t)(int)local_d4;
  ptr = parasail_memalign_int(0x10,size_01);
  size_00 = (ulong)(uint)s2Len;
  ptr_00 = parasail_memalign_int(0x10,size_00);
  size = (size_t)(int)(local_d4 + 1);
  ptr_01 = parasail_memalign_int(0x10,size);
  ptr_02 = parasail_memalign_int(0x10,size);
  ptr_03 = parasail_memalign_int(0x10,size);
  ptr_04 = parasail_memalign_int(0x10,size);
  ptr_05 = parasail_memalign_int(0x10,size_01);
  ptr_06 = parasail_memalign_int(0x10,size_01);
  ptr_07 = parasail_memalign_int(0x10,size_01);
  ptr_08 = parasail_memalign_int(0x10,size_01);
  ptr_09 = parasail_memalign_int(0x10,size);
  ptr_10 = parasail_memalign_int(0x10,size);
  ptr_11 = parasail_memalign_int(0x10,size);
  ptr_12 = parasail_memalign_int(0x10,size);
  ptr_13 = parasail_memalign_int(0x10,size_01);
  local_58 = (int)ptr_00;
  auVar17._0_4_ = -(uint)((int)ptr == 0);
  auVar17._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
  auVar17._8_4_ = -(uint)(local_58 == 0);
  auVar17._12_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
  auVar23._4_4_ = auVar17._0_4_;
  auVar23._0_4_ = auVar17._4_4_;
  auVar23._8_4_ = auVar17._12_4_;
  auVar23._12_4_ = auVar17._8_4_;
  auVar19._0_4_ = -(uint)((int)ptr_01 == 0);
  auVar19._4_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
  auVar19._8_4_ = -(uint)((int)ptr_02 == 0);
  auVar19._12_4_ = -(uint)((int)((ulong)ptr_02 >> 0x20) == 0);
  auVar24._4_4_ = auVar19._0_4_;
  auVar24._0_4_ = auVar19._4_4_;
  auVar24._8_4_ = auVar19._12_4_;
  auVar24._12_4_ = auVar19._8_4_;
  auVar24 = packssdw(auVar23 & auVar17,auVar24 & auVar19);
  auVar21._0_4_ = -(uint)((int)ptr_03 == 0);
  auVar21._4_4_ = -(uint)((int)((ulong)ptr_03 >> 0x20) == 0);
  auVar21._8_4_ = -(uint)((int)ptr_04 == 0);
  auVar21._12_4_ = -(uint)((int)((ulong)ptr_04 >> 0x20) == 0);
  auVar16._4_4_ = auVar21._0_4_;
  auVar16._0_4_ = auVar21._4_4_;
  auVar16._8_4_ = auVar21._12_4_;
  auVar16._12_4_ = auVar21._8_4_;
  auVar22._0_4_ = -(uint)((int)ptr_05 == 0);
  auVar22._4_4_ = -(uint)((int)((ulong)ptr_05 >> 0x20) == 0);
  auVar22._8_4_ = -(uint)((int)ptr_06 == 0);
  auVar22._12_4_ = -(uint)((int)((ulong)ptr_06 >> 0x20) == 0);
  auVar20._4_4_ = auVar22._0_4_;
  auVar20._0_4_ = auVar22._4_4_;
  auVar20._8_4_ = auVar22._12_4_;
  auVar20._12_4_ = auVar22._8_4_;
  auVar17 = packssdw(auVar16 & auVar21,auVar20 & auVar22);
  auVar17 = packssdw(auVar24,auVar17);
  if ((((((((auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0') {
    return (parasail_result_t *)0x0;
  }
  auVar18._0_4_ = -(uint)((int)((ulong)ptr_07 >> 0x20) == 0 && (int)ptr_07 == 0);
  auVar18._4_4_ = -(uint)((int)ptr_08 == 0 && (int)((ulong)ptr_08 >> 0x20) == 0);
  auVar18._8_4_ = -(uint)((int)((ulong)ptr_09 >> 0x20) == 0 && (int)ptr_09 == 0);
  auVar18._12_4_ = -(uint)((int)ptr_10 == 0 && (int)((ulong)ptr_10 >> 0x20) == 0);
  uVar5 = movmskps((int)ptr_10,auVar18);
  if ((char)uVar5 != '\0') {
    return (parasail_result_t *)0x0;
  }
  if (ptr_11 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_12 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  if (ptr_13 == (int *)0x0) {
    return (parasail_result_t *)0x0;
  }
  uVar13 = (ulong)local_d4;
  if (0 < (int)local_d4) {
    piVar10 = matrix->mapper;
    uVar6 = 0;
    do {
      ptr[uVar6] = piVar10[(byte)_s1[uVar6]];
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
  }
  piVar7 = ptr_04 + 1;
  piVar10 = matrix->mapper;
  uVar6 = 0;
  do {
    ptr_00[uVar6] = piVar10[(byte)_s2[uVar6]];
    uVar6 = uVar6 + 1;
  } while (size_00 != uVar6);
  *ptr_01 = 0;
  *ptr_02 = 0;
  *ptr_03 = 0;
  *ptr_04 = 0;
  iVar1 = 0;
  *ptr_09 = 0;
  if (0 < (int)local_d4) {
    uVar6 = 0;
    do {
      ptr_01[uVar6 + 1] = 0;
      ptr_02[uVar6 + 1] = 0;
      ptr_03[uVar6 + 1] = 0;
      piVar7[uVar6] = 0;
      uVar6 = uVar6 + 1;
    } while (uVar13 != uVar6);
    if (0 < (int)local_d4) {
      uVar6 = 0;
      do {
        ptr_05[uVar6] = -0x40000000;
        ptr_06[uVar6] = 0;
        ptr_07[uVar6] = 0;
        ptr_08[uVar6] = 0;
        uVar6 = uVar6 + 1;
      } while (uVar13 != uVar6);
    }
  }
  iVar4 = -0x40000000;
  uVar6 = 0;
  local_80 = local_d4;
  local_78 = 0;
  local_7c = 0;
  local_74 = s2Len;
  do {
    if ((int)local_d4 < 1) {
      *ptr_09 = 0;
    }
    else {
      lVar3 = 0;
      do {
        iVar8 = *(int *)((long)ptr_01 + lVar3 + 4) - open;
        iVar12 = *(int *)((long)ptr_05 + lVar3) - gap;
        if (iVar12 < iVar8) {
          *(int *)((long)ptr_05 + lVar3) = iVar8;
          *(undefined4 *)((long)ptr_06 + lVar3) = *(undefined4 *)((long)ptr_02 + lVar3 + 4);
          *(undefined4 *)((long)ptr_07 + lVar3) = *(undefined4 *)((long)ptr_03 + lVar3 + 4);
          piVar10 = piVar7;
        }
        else {
          *(int *)((long)ptr_05 + lVar3) = iVar12;
          piVar10 = ptr_08;
        }
        *(int *)((long)ptr_08 + lVar3) = *(int *)((long)piVar10 + lVar3) + 1;
        lVar3 = lVar3 + 4;
      } while (uVar13 * 4 != lVar3);
      *ptr_09 = 0;
      if (0 < (int)local_d4) {
        piVar10 = matrix->matrix;
        uVar11 = 0;
        do {
          if (matrix->type == 0) {
            iVar8 = ptr[uVar11];
          }
          else {
            iVar8 = (int)uVar11;
          }
          iVar8 = piVar10[(long)(matrix->size * iVar8) + (long)ptr_00[uVar6]];
          iVar12 = ptr_01[uVar11] + iVar8;
          ptr_13[uVar11] = (uint)(iVar12 < ptr_05[uVar11]);
          if (iVar12 < ptr_05[uVar11]) {
            ptr_09[uVar11 + 1] = ptr_05[uVar11];
            ptr_10[uVar11 + 1] = ptr_06[uVar11];
            ptr_11[uVar11 + 1] = ptr_07[uVar11];
            iVar8 = ptr_08[uVar11];
          }
          else {
            ptr_09[uVar11 + 1] = iVar12;
            ptr_10[uVar11 + 1] = (uint)(ptr[uVar11] == ptr_00[uVar6]) + ptr_02[uVar11];
            ptr_11[uVar11 + 1] = (uint)(0 < iVar8) + ptr_03[uVar11];
            iVar8 = ptr_04[uVar11] + 1;
          }
          ptr_12[uVar11 + 1] = iVar8;
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
        if (0 < (int)local_d4) {
          iVar8 = *ptr_01;
          iVar15 = -0x40000000;
          uVar11 = 0;
          iVar14 = 0;
          iVar12 = 0;
          local_c4 = 0;
          do {
            iVar9 = iVar15 - gap;
            iVar15 = ptr_09[uVar11];
            if (ptr_09[uVar11] <= iVar9) {
              iVar15 = iVar9;
            }
            if (iVar9 < iVar8) {
              local_c4 = ptr_02[uVar11];
              iVar12 = ptr_03[uVar11];
              iVar14 = ptr_04[uVar11];
            }
            iVar8 = iVar15 - open;
            iVar14 = iVar14 + 1;
            if (iVar8 < ptr_09[uVar11 + 1]) {
              ptr_01[uVar11 + 1] = ptr_09[uVar11 + 1];
LAB_0055364b:
              ptr_02[uVar11 + 1] = ptr_10[uVar11 + 1];
              ptr_03[uVar11 + 1] = ptr_11[uVar11 + 1];
              iVar9 = ptr_12[uVar11 + 1];
            }
            else {
              ptr_01[uVar11 + 1] = iVar8;
              if ((ptr_09[uVar11 + 1] == iVar8) && (ptr_13[uVar11] == 0)) goto LAB_0055364b;
              ptr_02[uVar11 + 1] = local_c4;
              ptr_03[uVar11 + 1] = iVar12;
              iVar9 = iVar14;
            }
            piVar7[uVar11] = iVar9;
            iVar8 = ptr_01[uVar11 + 1];
            if (iVar8 < 1) {
              iVar9 = 0;
              ptr_01[uVar11 + 1] = 0;
              ptr_02[uVar11 + 1] = 0;
              ptr_03[uVar11 + 1] = 0;
              piVar7[uVar11] = 0;
              iVar8 = ptr_01[uVar11 + 1];
            }
            if (iVar4 < iVar8) {
              local_7c = ptr_02[uVar11 + 1];
              local_78 = ptr_03[uVar11 + 1];
              local_80 = (uint)uVar11;
              local_74 = (int)uVar6;
              iVar4 = iVar8;
              iVar1 = iVar9;
            }
            uVar11 = uVar11 + 1;
          } while (uVar13 != uVar11);
        }
      }
    }
    *ptr_01 = 0;
    uVar6 = uVar6 + 1;
    if (uVar6 == size_00) {
      ppVar2->score = iVar4;
      ppVar2->end_query = local_80;
      ppVar2->end_ref = local_74;
      ((ppVar2->field_4).stats)->matches = local_7c;
      ((ppVar2->field_4).stats)->similar = local_78;
      ((ppVar2->field_4).stats)->length = iVar1;
      parasail_free(ptr_13);
      parasail_free(ptr_12);
      parasail_free(ptr_11);
      parasail_free(ptr_10);
      parasail_free(ptr_09);
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar2;
    }
  } while( true );
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H  = NULL;
    int * restrict HMB = NULL;
    int * restrict HM  = NULL;
    int * restrict HSB = NULL;
    int * restrict HS  = NULL;
    int * restrict HLB = NULL;
    int * restrict HL  = NULL;
    int * restrict E  = NULL;
    int * restrict EM = NULL;
    int * restrict ES = NULL;
    int * restrict EL = NULL;
    int * restrict HtB= NULL;
    int * restrict Ht = NULL;
    int * restrict HtMB= NULL;
    int * restrict HtM = NULL;
    int * restrict HtSB= NULL;
    int * restrict HtS = NULL;
    int * restrict HtLB= NULL;
    int * restrict HtL = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = 0;
    similar = 0;
    length = 0;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    HMB = parasail_memalign_int(16, s1Len+1);
    HM  = HMB+1;
    HSB = parasail_memalign_int(16, s1Len+1);
    HS  = HSB+1;
    HLB = parasail_memalign_int(16, s1Len+1);
    HL  = HLB+1;
    E  = parasail_memalign_int(16, s1Len);
    EM = parasail_memalign_int(16, s1Len);
    ES = parasail_memalign_int(16, s1Len);
    EL = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    HtMB= parasail_memalign_int(16, s1Len+1);
    HtM = HtMB+1;
    HtSB= parasail_memalign_int(16, s1Len+1);
    HtS = HtSB+1;
    HtLB= parasail_memalign_int(16, s1Len+1);
    HtL = HtLB+1;
    Ex = parasail_memalign_int(16, s1Len);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!HMB) return NULL;
    if (!HSB) return NULL;
    if (!HLB) return NULL;
    if (!E) return NULL;
    if (!EM) return NULL;
    if (!ES) return NULL;
    if (!EL) return NULL;
    if (!HtB) return NULL;
    if (!HtMB) return NULL;
    if (!HtSB) return NULL;
    if (!HtLB) return NULL;
    if (!Ex) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H,HM,HS,HL */
    H[-1] = 0;
    HM[-1] = 0;
    HS[-1] = 0;
    HL[-1] = 0;
    Ht[-1] = 0;
    for (i=0; i<s1Len; ++i) {
        H[i] = 0;
        HM[i] = 0;
        HS[i] = 0;
        HL[i] = 0;
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
        EM[i] = 0;
        ES[i] = 0;
        EL[i] = 0;
    }

    /* iterate over database */
    for (j=0; j<s2Len; ++j) {
        int Ft = NEG_INF_32;
        int FtM = 0;
        int FtS = 0;
        int FtL = 0;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            if (E_opn > E_ext) {
                E[i] = E_opn;
                EM[i] = HM[i];
                ES[i] = HS[i];
                EL[i] = HL[i];
            }
            else {
                E[i] = E_ext;
            }
            EL[i] += 1;
        }
        /* calculate Ht */
        Ht[-1] = 0;
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ex[i] = (E[i] > H_dag);
            if (H_dag >= E[i]) {
                Ht[i] = H_dag;
                HtM[i] = HM[i-1] + (s1[i]==s2[j]);
                HtS[i] = HS[i-1] + (matval > 0);
                HtL[i] = HL[i-1] + 1;
            }
            else {
                Ht[i] = E[i];
                HtM[i] = EM[i];
                HtS[i] = ES[i];
                HtL[i] = EL[i];
            }
        }
        /* calculate H,HM,HS,HL */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                FtM = HM[i-1];
                FtS = HS[i-1];
                FtL = HL[i-1];
            }
            FtL += 1;
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HM[i] = HtM[i];
                HS[i] = HtS[i];
                HL[i] = HtL[i];
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        /* we favor F/up/del when F and E scores tie */
                        HM[i] = FtM;
                        HS[i] = FtS;
                        HL[i] = FtL;
                    }
                    else {
                        HM[i] = HtM[i];
                        HS[i] = HtS[i];
                        HL[i] = HtL[i];
                    }
                }
                else {
                    HM[i] = FtM;
                    HS[i] = FtS;
                    HL[i] = FtL;
                }
            }
            if (0 >= H[i]) {
                H[i] = 0;
                HM[i] = 0;
                HS[i] = 0;
                HL[i] = 0;
            }
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*i*s2Len + j] = H[i];
            result->stats->tables->matches_table[1LL*i*s2Len + j] = HM[i];
            result->stats->tables->similar_table[1LL*i*s2Len + j] = HS[i];
            result->stats->tables->length_table[1LL*i*s2Len + j] = HL[i];
#endif
            /* max value */
            if (H[i] > score) {
                score = H[i];
                matches = HM[i];
                similar = HS[i];
                length = HL[i];
                end_query = i;
                end_ref = j;
            }
        }
        H[-1] = 0;
#ifdef PARASAIL_ROWCOL
        if (j == s2Len-1) {
            for (i=0; i<s1Len; ++i) {
                result->stats->rowcols->score_col[i] = H[i];
                result->stats->rowcols->matches_col[i] = HM[i];
                result->stats->rowcols->similar_col[i] = HS[i];
                result->stats->rowcols->length_col[i] = HL[i];
            }
        }
        result->stats->rowcols->score_row[j] = H[s1Len-1];
        result->stats->rowcols->matches_row[j] = HM[s1Len-1];
        result->stats->rowcols->similar_row[j] = HS[s1Len-1];
        result->stats->rowcols->length_row[j] = HL[s1Len-1];
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(Ex);
    parasail_free(HtLB);
    parasail_free(HtSB);
    parasail_free(HtMB);
    parasail_free(HtB);
    parasail_free(EL);
    parasail_free(ES);
    parasail_free(EM);
    parasail_free(E);
    parasail_free(HLB);
    parasail_free(HSB);
    parasail_free(HMB);
    parasail_free(HB);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}